

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O2

int getnumlimit(Header *h,char **fmt,int df)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = getnum(fmt,df);
  if (uVar1 - 0x11 < 0xfffffff0) {
    iVar2 = luaL_error(h->L,"integral size (%d) out of limits [1,%d]",(ulong)uVar1,0x10);
    return iVar2;
  }
  return uVar1;
}

Assistant:

static int getnumlimit (Header *h, const char **fmt, int df) {
  int sz = getnum(fmt, df);
  if (sz > MAXINTSIZE || sz <= 0)
    return luaL_error(h->L, "integral size (%d) out of limits [1,%d]",
                            sz, MAXINTSIZE);
  return sz;
}